

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitStream.hpp
# Opt level: O3

uint __thiscall
rc::detail::BitStream<rc::Random>::next<unsigned_int>(BitStream<rc::Random> *this,uint nbits)

{
  bool bVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  
  uVar8 = 0x20;
  if ((int)nbits < 0x20) {
    uVar8 = nbits;
  }
  if ((int)nbits < 1) {
    uVar4 = 0;
  }
  else {
    uVar5 = this->m_numBits;
    uVar4 = 0;
    uVar7 = uVar8;
    do {
      if (uVar5 == 0) {
        uVar2 = Random::next(&this->m_source);
        this->m_bits = uVar2;
        uVar5 = this->m_numBits + 0x40;
      }
      else {
        uVar2 = this->m_bits;
      }
      uVar3 = uVar5;
      if ((int)uVar7 < (int)uVar5) {
        uVar3 = uVar7;
      }
      uVar6 = ~(uint)(-1L << ((byte)uVar3 & 0x3f));
      if (0x3f < (int)uVar3) {
        uVar6 = 0xffffffff;
      }
      if (uVar3 < 0x40) {
        this->m_bits = uVar2 >> ((byte)uVar3 & 0x3f);
      }
      uVar4 = uVar4 | ((uint)uVar2 & uVar6) << ((char)uVar8 - (char)uVar7 & 0x3fU);
      uVar5 = uVar5 - uVar3;
      this->m_numBits = uVar5;
      uVar6 = uVar7 - uVar3;
      bVar1 = (int)uVar3 <= (int)uVar7;
      uVar7 = uVar6;
    } while (uVar6 != 0 && bVar1);
  }
  return uVar4;
}

Assistant:

T BitStream<Source>::next(int nbits, std::false_type) {
  using SourceType = decltype(m_source.next());
  nbits = std::min(nbits, numBits<T>());

  if (nbits == 0) {
    return 0;
  }

  T value = 0;
  int wantBits = nbits;
  while (wantBits > 0) {
    // Out of bits, refill
    if (m_numBits == 0) {
      m_bits = m_source.next();
      m_numBits += numBits<SourceType>();
    }

    const auto n = std::min(m_numBits, wantBits);
    const auto bits = m_bits & bitMask<SourceType>(n);
    value |= (bits << (nbits - wantBits));
    // To avoid right-shifting data beyond the width of the given type (which is
    // undefined behavior, because of course it is) only perform this shift-
    // assignment if we have room.
    if (static_cast<SourceType>(n) <
        static_cast<SourceType>(numBits<SourceType>())) {
      m_bits >>= static_cast<SourceType>(n);
    }
    m_numBits -= n;
    wantBits -= n;
  }

  if (std::is_signed<T>::value) {
    T signBit = static_cast<T>(0x1) << static_cast<T>(nbits - 1);
    if ((value & signBit) != 0) {
      // For signed values, we use the last bit as the sign bit. Since this
      // was 1, mask away by setting all bits above this one to 1 to make it a
      // negative number in 2's complement
      value |= ~bitMask<T>(nbits);
    }
  }

  return value;
}